

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook.c
# Opt level: O0

void duckdb_je_hook_invoke_dalloc(hook_dalloc_t type,void *address,uintptr_t *args_raw)

{
  _Bool _Var1;
  _Bool *p_Var2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  seq_hooks_t *in_stack_00000010;
  hook_dalloc h;
  _Bool for_each_hook_success;
  int for_each_hook_counter;
  hooks_internal_t hook;
  _Bool *in_hook;
  uint result;
  int iStack_64;
  code *pcStack_58;
  undefined8 uStack_48;
  byte bStack_40;
  
  if ((nhooks.repr != 0) && (p_Var2 = hook_reentrantp(), (*p_Var2 & 1U) == 0)) {
    *p_Var2 = true;
    for (iStack_64 = 0; iStack_64 < 4; iStack_64 = iStack_64 + 1) {
      _Var1 = seq_try_load_hooks((hooks_internal_t *)h,in_stack_00000010);
      if (((_Var1) && ((bStack_40 & 1) != 0)) && (pcStack_58 != (code *)0x0)) {
        (*pcStack_58)(uStack_48,in_EDI,in_RSI,in_RDX);
      }
    }
    *p_Var2 = false;
  }
  return;
}

Assistant:

void
hook_invoke_dalloc(hook_dalloc_t type, void *address, uintptr_t args_raw[3]) {
	HOOK_PROLOGUE
	hooks_internal_t hook;
	FOR_EACH_HOOK_BEGIN(&hook)
		hook_dalloc h = hook.hooks.dalloc_hook;
		if (h != NULL) {
			h(hook.hooks.extra, type, address, args_raw);
		}
	FOR_EACH_HOOK_END
	HOOK_EPILOGUE
}